

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O3

void __thiscall indk::NeuralNet::doInterlinkSyncStructure(NeuralNet *this)

{
  Interlink *this_00;
  bool bVar1;
  string local_38;
  
  if (this->InterlinkService != (Interlink *)0x0) {
    bVar1 = Interlink::isInterlinked(this->InterlinkService);
    if (bVar1) {
      this_00 = this->InterlinkService;
      getStructure_abi_cxx11_(&local_38,this,true);
      Interlink::doUpdateStructure(this_00,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void indk::NeuralNet::doInterlinkSyncStructure() {
    if (!InterlinkService || InterlinkService && !InterlinkService->isInterlinked()) return;
    InterlinkService -> doUpdateStructure(getStructure());
}